

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_maddr_q(DisasContext_conflict14 *ctx,TCGv_i32 ret,TCGv_i32 r1,TCGv_i32 r2,TCGv_i32 r3,
                uint32_t n)

{
  TCGContext_conflict9 *tcg_ctx;
  uintptr_t o_3;
  TCGv_i32 pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_4;
  uintptr_t o_2;
  TCGTemp *local_58;
  TCGv_i32 local_50;
  TCGv_i32 local_48;
  TCGv_i32 local_40;
  TCGTemp *local_38;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  pTVar1 = tcg_const_i32_tricore(tcg_ctx,n);
  local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_50 = r1 + (long)tcg_ctx;
  local_48 = r2 + (long)tcg_ctx;
  local_40 = r3 + (long)tcg_ctx;
  local_38 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_tricore(tcg_ctx,helper_maddr_q,(TCGTemp *)(ret + (long)tcg_ctx),5,&local_58);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

static inline void
gen_maddr_q(DisasContext *ctx, TCGv ret, TCGv r1, TCGv r2, TCGv r3, uint32_t n)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_const_i32(tcg_ctx, n);
    gen_helper_maddr_q(tcg_ctx, ret, tcg_ctx->cpu_env, r1, r2, r3, temp);
    tcg_temp_free(tcg_ctx, temp);
}